

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushStyleColor(ImGuiCol idx,ImU32 col)

{
  ImVec4 *pIVar1;
  int in_EDI;
  ImVec4 IVar2;
  ImGuiColorMod backup;
  ImGuiContext *g;
  ImGuiColorMod *in_stack_ffffffffffffffb8;
  ImVector<ImGuiColorMod> *this;
  undefined1 local_24 [20];
  ImGuiContext *local_10;
  int local_4;
  
  local_10 = GImGui;
  this = (ImVector<ImGuiColorMod> *)local_24;
  local_4 = in_EDI;
  ImGuiColorMod::ImGuiColorMod((ImGuiColorMod *)0x129eca);
  local_24._0_4_ = local_4;
  pIVar1 = (local_10->Style).Colors + local_4;
  local_24._4_8_ = *(undefined8 *)pIVar1;
  local_24._12_4_ = pIVar1->z;
  local_24._16_4_ = pIVar1->w;
  ImVector<ImGuiColorMod>::push_back(this,in_stack_ffffffffffffffb8);
  IVar2 = ColorConvertU32ToFloat4(0);
  pIVar1 = (local_10->Style).Colors + local_4;
  pIVar1->x = (float)(int)IVar2._0_8_;
  pIVar1->y = (float)(int)((ulong)IVar2._0_8_ >> 0x20);
  pIVar1->z = (float)(int)IVar2._8_8_;
  pIVar1->w = (float)(int)((ulong)IVar2._8_8_ >> 0x20);
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    g.Style.Colors[idx] = ColorConvertU32ToFloat4(col);
}